

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvTools.cpp
# Opt level: O0

void glslang::SpirvToolsTransform
               (TIntermediate *intermediate,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv,SpvBuildLogger *logger,
               SpvOptions *options)

{
  spv_target_env env;
  SpvVersion *pSVar1;
  uint *puVar2;
  size_type sVar3;
  spv_optimizer_options psVar4;
  reference pvVar5;
  PassToken local_170;
  MessageConsumer local_168;
  Optimizer local_148;
  Optimizer optimizer2;
  OptimizerOptions spvOptOptions;
  PassToken local_130;
  PassToken local_128;
  PassToken local_120;
  PassToken local_118;
  PassToken local_110;
  PassToken local_108;
  PassToken local_100;
  PassToken local_f8;
  PassToken local_f0;
  PassToken local_e8;
  PassToken local_e0;
  PassToken local_d8;
  PassToken local_d0;
  PassToken local_c8;
  PassToken local_c0;
  PassToken local_b8;
  PassToken local_b0;
  PassToken local_a8;
  PassToken local_a0;
  PassToken local_98;
  PassToken local_90;
  PassToken local_88;
  PassToken local_80;
  PassToken local_78;
  PassToken local_70;
  PassToken local_68;
  PassToken local_60;
  MessageConsumer local_58;
  Optimizer local_38;
  Optimizer optimizer;
  spv_target_env target_env;
  SpvOptions *options_local;
  SpvBuildLogger *logger_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_local;
  TIntermediate *intermediate_local;
  
  pSVar1 = TIntermediate::getSpv(intermediate);
  optimizer.impl_._M_t.
  super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl._4_4_ =
       MapToSpirvToolsEnv(pSVar1,logger);
  spvtools::Optimizer::Optimizer
            (&local_38,
             optimizer.impl_._M_t.
             super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
             .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl._4_4_);
  std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>::
  function<void(&)(spv_message_level_t,char_const*,spv_position_t_const&,char_const*),void>
            ((function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)> *)
             &local_58,OptimizerMesssageConsumer);
  spvtools::Optimizer::SetMessageConsumer(&local_38,&local_58);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function(&local_58);
  if ((options->stripDebugInfo & 1U) != 0) {
    spvtools::CreateStripDebugInfoPass();
    spvtools::Optimizer::RegisterPass(&local_38,&local_60);
    spvtools::Optimizer::PassToken::~PassToken(&local_60);
  }
  spvtools::CreateWrapOpKillPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_68);
  spvtools::Optimizer::PassToken::~PassToken(&local_68);
  spvtools::CreateDeadBranchElimPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_70);
  spvtools::Optimizer::PassToken::~PassToken(&local_70);
  spvtools::CreateMergeReturnPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_78);
  spvtools::Optimizer::PassToken::~PassToken(&local_78);
  spvtools::CreateInlineExhaustivePass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_80);
  spvtools::Optimizer::PassToken::~PassToken(&local_80);
  spvtools::CreateEliminateDeadFunctionsPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_88);
  spvtools::Optimizer::PassToken::~PassToken(&local_88);
  spvtools::CreateScalarReplacementPass((spvtools *)&local_90,100);
  spvtools::Optimizer::RegisterPass(&local_38,&local_90);
  spvtools::Optimizer::PassToken::~PassToken(&local_90);
  spvtools::CreateLocalAccessChainConvertPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_98);
  spvtools::Optimizer::PassToken::~PassToken(&local_98);
  spvtools::CreateLocalSingleBlockLoadStoreElimPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_a0);
  spvtools::Optimizer::PassToken::~PassToken(&local_a0);
  spvtools::CreateLocalSingleStoreElimPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_a8);
  spvtools::Optimizer::PassToken::~PassToken(&local_a8);
  spvtools::CreateSimplificationPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_b0);
  spvtools::Optimizer::PassToken::~PassToken(&local_b0);
  spvtools::CreateAggressiveDCEPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_b8);
  spvtools::Optimizer::PassToken::~PassToken(&local_b8);
  spvtools::CreateVectorDCEPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_c0);
  spvtools::Optimizer::PassToken::~PassToken(&local_c0);
  spvtools::CreateDeadInsertElimPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_c8);
  spvtools::Optimizer::PassToken::~PassToken(&local_c8);
  spvtools::CreateAggressiveDCEPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_d0);
  spvtools::Optimizer::PassToken::~PassToken(&local_d0);
  spvtools::CreateDeadBranchElimPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_d8);
  spvtools::Optimizer::PassToken::~PassToken(&local_d8);
  spvtools::CreateBlockMergePass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_e0);
  spvtools::Optimizer::PassToken::~PassToken(&local_e0);
  spvtools::CreateLocalMultiStoreElimPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_e8);
  spvtools::Optimizer::PassToken::~PassToken(&local_e8);
  spvtools::CreateIfConversionPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_f0);
  spvtools::Optimizer::PassToken::~PassToken(&local_f0);
  spvtools::CreateSimplificationPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_f8);
  spvtools::Optimizer::PassToken::~PassToken(&local_f8);
  spvtools::CreateAggressiveDCEPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_100);
  spvtools::Optimizer::PassToken::~PassToken(&local_100);
  spvtools::CreateVectorDCEPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_108);
  spvtools::Optimizer::PassToken::~PassToken(&local_108);
  spvtools::CreateDeadInsertElimPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_110);
  spvtools::Optimizer::PassToken::~PassToken(&local_110);
  spvtools::CreateInterpolateFixupPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_118);
  spvtools::Optimizer::PassToken::~PassToken(&local_118);
  if ((options->optimizeSize & 1U) != 0) {
    spvtools::CreateRedundancyEliminationPass();
    spvtools::Optimizer::RegisterPass(&local_38,&local_120);
    spvtools::Optimizer::PassToken::~PassToken(&local_120);
    spvtools::CreateEliminateDeadInputComponentsSafePass();
    spvtools::Optimizer::RegisterPass(&local_38,&local_128);
    spvtools::Optimizer::PassToken::~PassToken(&local_128);
  }
  spvtools::CreateAggressiveDCEPass();
  spvtools::Optimizer::RegisterPass(&local_38,&local_130);
  spvtools::Optimizer::PassToken::~PassToken(&local_130);
  spvtools::CreateCFGCleanupPass();
  spvtools::Optimizer::RegisterPass(&local_38,(PassToken *)&spvOptOptions);
  spvtools::Optimizer::PassToken::~PassToken((PassToken *)&spvOptOptions);
  spvtools::OptimizerOptions::OptimizerOptions((OptimizerOptions *)&optimizer2);
  if ((options->optimizerAllowExpandedIDBound & 1U) != 0) {
    spvtools::OptimizerOptions::set_max_id_bound((OptimizerOptions *)&optimizer2,0x3fffffff);
  }
  pSVar1 = TIntermediate::getSpv(intermediate);
  env = MapToSpirvToolsEnv(pSVar1,logger);
  spvtools::Optimizer::SetTargetEnv(&local_38,env);
  spvtools::OptimizerOptions::set_run_validator((OptimizerOptions *)&optimizer2,false);
  puVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(spirv);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(spirv);
  psVar4 = spvtools::OptimizerOptions::operator_cast_to_spv_optimizer_options_t_
                     ((OptimizerOptions *)&optimizer2);
  spvtools::Optimizer::Run(&local_38,puVar2,sVar3,spirv,psVar4);
  if ((((options->optimizerAllowExpandedIDBound & 1U) != 0) &&
      (sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(spirv), 3 < sVar3)) &&
     (pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](spirv,3),
     0x3fffff < *pvVar5)) {
    spvtools::Optimizer::Optimizer
              (&local_148,
               optimizer.impl_._M_t.
               super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
               .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl._4_4_);
    std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>::
    function<void(&)(spv_message_level_t,char_const*,spv_position_t_const&,char_const*),void>
              ((function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)> *)
               &local_168,OptimizerMesssageConsumer);
    spvtools::Optimizer::SetMessageConsumer(&local_148,&local_168);
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    ~function(&local_168);
    spvtools::CreateCompactIdsPass();
    spvtools::Optimizer::RegisterPass(&local_148,&local_170);
    spvtools::Optimizer::PassToken::~PassToken(&local_170);
    puVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(spirv);
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(spirv);
    psVar4 = spvtools::OptimizerOptions::operator_cast_to_spv_optimizer_options_t_
                       ((OptimizerOptions *)&optimizer2);
    spvtools::Optimizer::Run(&local_148,puVar2,sVar3,spirv,psVar4);
    spvtools::Optimizer::~Optimizer(&local_148);
  }
  spvtools::OptimizerOptions::~OptimizerOptions((OptimizerOptions *)&optimizer2);
  spvtools::Optimizer::~Optimizer(&local_38);
  return;
}

Assistant:

void SpirvToolsTransform(const glslang::TIntermediate& intermediate, std::vector<unsigned int>& spirv,
                         spv::SpvBuildLogger* logger, const SpvOptions* options)
{
    spv_target_env target_env = MapToSpirvToolsEnv(intermediate.getSpv(), logger);

    spvtools::Optimizer optimizer(target_env);
    optimizer.SetMessageConsumer(OptimizerMesssageConsumer);

    // If debug (specifically source line info) is being generated, propagate
    // line information into all SPIR-V instructions. This avoids loss of
    // information when instructions are deleted or moved. Later, remove
    // redundant information to minimize final SPRIR-V size.
    if (options->stripDebugInfo) {
        optimizer.RegisterPass(spvtools::CreateStripDebugInfoPass());
    }
    optimizer.RegisterPass(spvtools::CreateWrapOpKillPass());
    optimizer.RegisterPass(spvtools::CreateDeadBranchElimPass());
    optimizer.RegisterPass(spvtools::CreateMergeReturnPass());
    optimizer.RegisterPass(spvtools::CreateInlineExhaustivePass());
    optimizer.RegisterPass(spvtools::CreateEliminateDeadFunctionsPass());
    optimizer.RegisterPass(spvtools::CreateScalarReplacementPass());
    optimizer.RegisterPass(spvtools::CreateLocalAccessChainConvertPass());
    optimizer.RegisterPass(spvtools::CreateLocalSingleBlockLoadStoreElimPass());
    optimizer.RegisterPass(spvtools::CreateLocalSingleStoreElimPass());
    optimizer.RegisterPass(spvtools::CreateSimplificationPass());
    optimizer.RegisterPass(spvtools::CreateAggressiveDCEPass());
    optimizer.RegisterPass(spvtools::CreateVectorDCEPass());
    optimizer.RegisterPass(spvtools::CreateDeadInsertElimPass());
    optimizer.RegisterPass(spvtools::CreateAggressiveDCEPass());
    optimizer.RegisterPass(spvtools::CreateDeadBranchElimPass());
    optimizer.RegisterPass(spvtools::CreateBlockMergePass());
    optimizer.RegisterPass(spvtools::CreateLocalMultiStoreElimPass());
    optimizer.RegisterPass(spvtools::CreateIfConversionPass());
    optimizer.RegisterPass(spvtools::CreateSimplificationPass());
    optimizer.RegisterPass(spvtools::CreateAggressiveDCEPass());
    optimizer.RegisterPass(spvtools::CreateVectorDCEPass());
    optimizer.RegisterPass(spvtools::CreateDeadInsertElimPass());
    optimizer.RegisterPass(spvtools::CreateInterpolateFixupPass());
    if (options->optimizeSize) {
        optimizer.RegisterPass(spvtools::CreateRedundancyEliminationPass());
        optimizer.RegisterPass(spvtools::CreateEliminateDeadInputComponentsSafePass());
    }
    optimizer.RegisterPass(spvtools::CreateAggressiveDCEPass());
    optimizer.RegisterPass(spvtools::CreateCFGCleanupPass());

    spvtools::OptimizerOptions spvOptOptions;
    if (options->optimizerAllowExpandedIDBound)
        spvOptOptions.set_max_id_bound(0x3FFFFFFF);
    optimizer.SetTargetEnv(MapToSpirvToolsEnv(intermediate.getSpv(), logger));
    spvOptOptions.set_run_validator(false); // The validator may run as a separate step later on
    optimizer.Run(spirv.data(), spirv.size(), &spirv, spvOptOptions);

    if (options->optimizerAllowExpandedIDBound) {
        if (spirv.size() > 3 && spirv[3] > kDefaultMaxIdBound) {
            spvtools::Optimizer optimizer2(target_env);
            optimizer2.SetMessageConsumer(OptimizerMesssageConsumer);
            optimizer2.RegisterPass(spvtools::CreateCompactIdsPass());
            optimizer2.Run(spirv.data(), spirv.size(), &spirv, spvOptOptions);
        }
    }
}